

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O3

bool __thiscall RenX_ExtraLoggingPlugin::initialize(RenX_ExtraLoggingPlugin *this)

{
  undefined1 *this_00;
  string *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  const_iterator cVar6;
  FILE *pFVar7;
  char *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  undefined1 auVar8 [16];
  string logFile;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  long local_a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  string local_58;
  string *local_38;
  
  string_printf_abi_cxx11_
            (&local_58,"[%.*s] %.*s",*(undefined8 *)(RenX::tags + 0x15b0),
             *(undefined8 *)(RenX::tags + 0x15a8),*(undefined8 *)(RenX::tags + 0x1730),
             *(undefined8 *)(RenX::tags + 0x1728));
  local_b8._M_len = 10;
  local_b8._M_str = "FilePrefix";
  this_00 = &this->field_0x60;
  cVar6 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,&local_b8);
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  if (cVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      local_d8.field_2._8_8_ = local_58.field_2._8_8_;
    }
    else {
      local_d8._M_dataplus._M_p = local_58._M_dataplus._M_p;
    }
    local_d8.field_2._M_allocated_capacity._1_7_ = local_58.field_2._M_allocated_capacity._1_7_;
    local_d8.field_2._M_local_buf[0] = local_58.field_2._M_local_buf[0];
    local_d8._M_string_length = local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28),
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30) +
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->filePrefix,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  pcVar3 = (this->filePrefix)._M_dataplus._M_p;
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + (this->filePrefix)._M_string_length);
  local_b8._M_len = 0xd;
  local_b8._M_str = "ConsolePrefix";
  cVar6 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,&local_b8);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if (local_98 == &local_88) {
      local_d8.field_2._8_8_ = local_88._8_8_;
      local_d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8._M_dataplus._M_p = (pointer)local_98;
    }
    local_d8.field_2._M_allocated_capacity._1_7_ = local_88._M_allocated_capacity._1_7_;
    local_d8.field_2._M_local_buf[0] = local_88._M_local_buf[0];
    local_d8._M_string_length = local_90;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_98 = &local_88;
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28),
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30) +
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28));
  }
  local_38 = (string *)&this->consolePrefix;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,&local_d8
            );
  paVar1 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0])
                             + 1);
  }
  string_printf_abi_cxx11_
            (&local_78,"Time: %.*s %.*s",*(undefined8 *)(RenX::tags + 0x15b0),
             *(undefined8 *)(RenX::tags + 0x15a8),*(undefined8 *)(RenX::tags + 0x1590),
             *(undefined8 *)(RenX::tags + 0x1588));
  local_b8._M_len = 0xc;
  local_b8._M_str = "NewDayFormat";
  cVar6 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,&local_b8);
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  if (cVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_d8.field_2._8_8_ = local_78.field_2._8_8_;
    }
    else {
      local_d8._M_dataplus._M_p = local_78._M_dataplus._M_p;
    }
    local_d8.field_2._M_allocated_capacity._1_7_ = local_78.field_2._M_allocated_capacity._1_7_;
    local_d8.field_2._M_local_buf[0] = local_78.field_2._M_local_buf[0];
    local_d8._M_string_length = local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28),
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30) +
               *(long *)((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28));
  }
  this_01 = &this->newDayFmt;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_01,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)0xe;
  local_d8._M_string_length = 0x10a042;
  cVar6 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this_00,(basic_string_view<char,_std::char_traits<char>_> *)&local_d8);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    bVar5 = true;
  }
  else {
    in_string._M_str = extraout_RDX;
    in_string._M_len =
         *(size_t *)
          ((long)cVar6.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                 ._M_cur + 0x28);
    bVar5 = Jupiter::asBool<char>
                      (*(Jupiter **)
                        ((long)cVar6.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30),in_string);
  }
  this->printToConsole = bVar5;
  auVar8 = Jupiter::Config::get(&this->field_0x38,7,"LogFile",0);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,auVar8._8_8_,auVar8._0_8_ + auVar8._8_8_);
  RenX::sanitizeTags((string *)&this->filePrefix);
  RenX::sanitizeTags(local_38);
  RenX::sanitizeTags((string *)this_01);
  if ((char *)local_d8._M_string_length == (char *)0x0) {
    this->file = (FILE *)0x0;
  }
  else {
    pFVar7 = fopen(local_d8._M_dataplus._M_p,"a+b");
    this->file = (FILE *)pFVar7;
    if (pFVar7 != (FILE *)0x0) {
      sVar4 = (this->newDayFmt)._M_string_length;
      if (sVar4 == 0) {
        bVar5 = true;
      }
      else {
        pcVar3 = (this_01->_M_dataplus)._M_p;
        local_b8._M_len = (size_t)local_a8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_b8,pcVar3,pcVar3 + sVar4);
        RenX::processTags((string *)&local_b8,(Server *)0x0,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                          (BuildingInfo *)0x0);
        fwrite((void *)local_b8._M_len,1,(size_t)local_b8._M_str,(FILE *)this->file);
        fputs("\r\n",(FILE *)this->file);
        if ((long *)local_b8._M_len != local_a8) {
          operator_delete((void *)local_b8._M_len,local_a8[0] + 1);
        }
        bVar5 = this->file != (FILE *)0x0;
      }
      goto LAB_00108b19;
    }
  }
  bVar5 = false;
LAB_00108b19:
  bVar2 = this->printToConsole;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return (bool)(bVar5 | bVar2 & 1U);
}

Assistant:

bool RenX_ExtraLoggingPlugin::initialize() {
	RenX_ExtraLoggingPlugin::filePrefix = this->config.get("FilePrefix"sv, string_printf("[%.*s] %.*s", RenX::tags->timeTag.size(),
		RenX::tags->timeTag.data(), RenX::tags->serverPrefixTag.size(),
		RenX::tags->serverPrefixTag.data()));
	RenX_ExtraLoggingPlugin::consolePrefix = this->config.get("ConsolePrefix"sv, RenX_ExtraLoggingPlugin::filePrefix);
	RenX_ExtraLoggingPlugin::newDayFmt = this->config.get("NewDayFormat"sv, string_printf("Time: %.*s %.*s", RenX::tags->timeTag.size(),
		RenX::tags->timeTag.data(), RenX::tags->dateTag.size(),
		RenX::tags->dateTag.data()));
	RenX_ExtraLoggingPlugin::printToConsole = this->config.get<bool>("PrintToConsole"sv, true);
	const std::string logFile = static_cast<std::string>(this->config.get("LogFile"sv));

	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::filePrefix);
	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::consolePrefix);
	RenX::sanitizeTags(RenX_ExtraLoggingPlugin::newDayFmt);

	if (!logFile.empty()) {
		RenX_ExtraLoggingPlugin::file = fopen(logFile.c_str(), "a+b");
		if (RenX_ExtraLoggingPlugin::file != nullptr && !RenX_ExtraLoggingPlugin::newDayFmt.empty()) {
			std::string line = RenX_ExtraLoggingPlugin::newDayFmt;
			RenX::processTags(line);
			fwrite(line.data(), sizeof(char), line.size(), file);
			fputs("\r\n", file);
		}
	}
	else
		RenX_ExtraLoggingPlugin::file = nullptr;

	return RenX_ExtraLoggingPlugin::file != nullptr || RenX_ExtraLoggingPlugin::printToConsole;
}